

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

ctrl_t * phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::unique_ptr<int,std::default_delete<int>>>,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>>
                   (void)

{
  return EmptyGroup<std::is_same<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
         ::empty_group;
}

Assistant:

inline ctrl_t* EmptyGroup() {
  PHMAP_IF_CONSTEXPR (std_alloc_t::value) {
      alignas(16) static constexpr ctrl_t empty_group[] = {
          kSentinel, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty,
          kEmpty,    kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty, kEmpty};

      return const_cast<ctrl_t*>(empty_group);
  } else {
       return nullptr;
  }
}